

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaExporter::WriteNode(ColladaExporter *this,aiScene *pScene,aiNode *pNode)

{
  undefined1 *puVar1;
  uint uVar2;
  aiCamera **ppaVar3;
  aiCamera *paVar4;
  aiMesh *mesh;
  size_type sVar5;
  _Base_ptr p_Var6;
  uint *puVar7;
  bool bVar8;
  string *psVar9;
  _Alloc_hider _Var10;
  int iVar11;
  uint uVar12;
  aiBone *paVar13;
  aiBone *paVar14;
  size_t sVar15;
  ostream *poVar16;
  long *plVar17;
  aiNode *paVar18;
  aiScene *paVar19;
  long *plVar20;
  size_t a;
  long lVar21;
  size_t i;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  string node_id;
  string node_name;
  stringstream ss;
  string local_318;
  string *local_2f8;
  aiScene *local_2f0;
  aiNode *local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  aiScene *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  string local_220;
  string local_200;
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1d0;
  undefined8 uStack_1c0;
  float local_1b8;
  undefined8 local_1b4;
  undefined8 uStack_1ac;
  float local_1a4;
  ios_base local_160 [264];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  if ((pNode->mName).length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1e0 + 0x10),"Node_",5);
    std::ostream::_M_insert<void_const*>((ostream *)(local_1e0 + 0x10));
    std::__cxx11::stringbuf::str();
    sVar5 = local_2d8._M_string_length;
    _Var10._M_p = local_2d8._M_dataplus._M_p;
    if (local_2d8._M_string_length < 0x400) {
      (pNode->mName).length = (ai_uint32)local_2d8._M_string_length;
      memcpy((pNode->mName).data,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
      (pNode->mName).data[sVar5] = '\0';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != &local_2d8.field_2) {
      operator_delete(_Var10._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base(local_160);
  }
  local_2f8 = (string *)(pNode->mName).data;
  paVar13 = findBone(pScene,(char *)local_2f8);
  local_270 = pScene;
  if (paVar13 == (aiBone *)0x0) {
    pcVar24 = "NODE";
  }
  else {
    if ((pNode->mParent == (aiNode *)0x0) ||
       (paVar14 = findBone(pScene,(pNode->mParent->mName).data), paVar14 == (aiBone *)0x0)) {
      bVar8 = true;
      pcVar24 = "JOINT";
      goto LAB_003160fe;
    }
    pcVar24 = "JOINT";
  }
  bVar8 = false;
LAB_003160fe:
  psVar9 = local_2f8;
  local_1e0._0_8_ = local_1e0 + 0x10;
  sVar15 = strlen((char *)local_2f8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,psVar9,psVar9 + sVar15);
  XMLIDEncode(&local_2d8,(string *)local_1e0);
  local_2e8 = pNode;
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,
                    CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                             aStack_1d0._M_allocated_capacity._0_4_) + 1);
  }
  psVar9 = local_2f8;
  local_1e0._0_8_ = local_1e0 + 0x10;
  sVar15 = strlen((char *)local_2f8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,psVar9,psVar9 + sVar15);
  XMLEscape(&local_200,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_,
                    CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                             aStack_1d0._M_allocated_capacity._0_4_) + 1);
  }
  puVar1 = &this->field_0x38;
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<node ",6);
  if (bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" ",2);
    if (paVar13 == (aiBone *)0x0) {
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
    }
    else {
      std::operator+(&local_268,"sid=\"",&local_2d8);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1e0._0_8_ = local_1e0 + 0x10;
      plVar20 = plVar17 + 2;
      if ((long *)*plVar17 == plVar20) {
        aStack_1d0._8_8_ = plVar17[3];
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      }
      else {
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
        local_1e0._0_8_ = (long *)*plVar17;
      }
      local_1e0._8_4_ = (undefined4)plVar17[1];
      local_1e0._12_4_ = (undefined4)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)plVar20;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(char *)local_1e0._0_8_,CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,
                      CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                               aStack_1d0._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar13 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2)) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->mFoundSkeletonRootNodeID);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"id=\"",4);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)puVar1,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" ",2);
    if (paVar13 == (aiBone *)0x0) {
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
    }
    else {
      std::operator+(&local_268,"sid=\"",&local_2d8);
      plVar17 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_1e0._0_8_ = local_1e0 + 0x10;
      plVar20 = plVar17 + 2;
      if ((long *)*plVar17 == plVar20) {
        aStack_1d0._8_8_ = plVar17[3];
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
      }
      else {
        aStack_1d0._M_allocated_capacity._0_4_ = (undefined4)*plVar20;
        aStack_1d0._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar20 >> 0x20);
        local_1e0._0_8_ = (long *)*plVar17;
      }
      local_1e0._8_4_ = (undefined4)plVar17[1];
      local_1e0._12_4_ = (undefined4)((ulong)plVar17[1] >> 0x20);
      *plVar17 = (long)plVar20;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,(char *)local_1e0._0_8_,CONCAT44(local_1e0._12_4_,local_1e0._8_4_));
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,
                      CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                               aStack_1d0._M_allocated_capacity._0_4_) + 1);
    }
    if ((paVar13 != (aiBone *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2)) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," name=\"",7);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\" type=\"",8);
  sVar15 = strlen(pcVar24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar24,sVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  local_2f0 = (aiScene *)&this->startstr;
  std::__cxx11::string::append((char *)local_2f0);
  local_288._0_4_ = (local_2e8->mTransformation).a1;
  local_288._4_4_ = (local_2e8->mTransformation).a2;
  uStack_280._0_4_ = (local_2e8->mTransformation).a3;
  uStack_280._4_4_ = (local_2e8->mTransformation).a4;
  local_298._0_4_ = (local_2e8->mTransformation).b1;
  local_298._4_4_ = (local_2e8->mTransformation).b2;
  uStack_290._0_4_ = (local_2e8->mTransformation).b3;
  uStack_290._4_4_ = (local_2e8->mTransformation).b4;
  local_2a8._0_4_ = (local_2e8->mTransformation).c1;
  local_2a8._4_4_ = (local_2e8->mTransformation).c2;
  uStack_2a0._0_4_ = (local_2e8->mTransformation).c3;
  uStack_2a0._4_4_ = (local_2e8->mTransformation).c4;
  local_2b8._0_4_ = (local_2e8->mTransformation).d1;
  local_2b8._4_4_ = (local_2e8->mTransformation).d2;
  uStack_2b0._0_4_ = (local_2e8->mTransformation).d3;
  uStack_2b0._4_4_ = (local_2e8->mTransformation).d4;
  uVar23 = (ulong)this->mScene->mNumCameras;
  if (uVar23 != 0) {
    ppaVar3 = this->mScene->mCameras;
    uVar12 = (local_2e8->mName).length;
    uVar22 = 0;
    do {
      paVar4 = ppaVar3[uVar22];
      if ((paVar4->mName).length == uVar12) {
        iVar11 = bcmp((paVar4->mName).data,local_2f8,(ulong)uVar12);
        if (iVar11 == 0) {
          local_1e0._0_4_ = 1.0;
          local_1e0._4_4_ = 0.0;
          local_1e0._8_4_ = 0.0;
          local_1e0._12_4_ = 0.0;
          aStack_1d0._M_allocated_capacity._0_4_ = 0.0;
          aStack_1d0._M_allocated_capacity._4_4_ = 1.0;
          aStack_1d0._8_8_ = 0;
          uStack_1c0._0_4_ = 0.0;
          uStack_1c0._4_4_ = 0.0;
          local_1b8 = 1.0;
          local_1b4._0_4_ = 0.0;
          local_1b4._4_4_ = 0.0;
          uStack_1ac._0_4_ = 0.0;
          uStack_1ac._4_4_ = 0.0;
          local_1a4 = 1.0;
          aiCamera::GetCameraMatrix(ppaVar3[uVar22],(aiMatrix4x4 *)local_1e0);
          fVar29 = (float)local_1e0._0_4_ * 0.0 + (float)local_1e0._4_4_ * 0.0;
          fVar28 = fVar29 + (float)local_1e0._8_4_ * 0.0 + (float)local_1e0._12_4_;
          fVar25 = (float)local_1e0._12_4_ * 0.0;
          fVar27 = ((float)local_1e0._4_4_ * 0.0 - (float)local_1e0._0_4_) +
                   (float)local_1e0._8_4_ * 0.0 + fVar25;
          local_48 = ZEXT416((uint)fVar27);
          fVar26 = fVar25 + (float)local_1e0._8_4_ * 0.0 +
                            (float)local_1e0._0_4_ * 0.0 + (float)local_1e0._4_4_;
          fVar25 = fVar25 + (float)local_1e0._8_4_ * -1.0 + fVar29;
          fVar37 = (float)aStack_1d0._M_allocated_capacity._0_4_ * 0.0 +
                   (float)aStack_1d0._M_allocated_capacity._4_4_ * 0.0;
          fVar35 = fVar37 + (float)aStack_1d0._8_4_ * 0.0 + (float)aStack_1d0._12_4_;
          fVar30 = (float)aStack_1d0._12_4_ * 0.0;
          fVar29 = ((float)aStack_1d0._M_allocated_capacity._4_4_ * 0.0 -
                   (float)aStack_1d0._M_allocated_capacity._0_4_) + (float)aStack_1d0._8_4_ * 0.0 +
                   fVar30;
          fVar31 = fVar30 + (float)aStack_1d0._8_4_ * 0.0 +
                            (float)aStack_1d0._M_allocated_capacity._0_4_ * 0.0 +
                            (float)aStack_1d0._M_allocated_capacity._4_4_;
          fVar30 = fVar30 + (float)aStack_1d0._8_4_ * -1.0 + fVar37;
          fStack_54 = (float)uStack_1c0 * 0.0 + uStack_1c0._4_4_ * 0.0;
          local_58 = fStack_54 + local_1b8 * 0.0 + (float)local_1b4;
          fVar40 = (float)local_1b4 * 0.0;
          fVar32 = (uStack_1c0._4_4_ * 0.0 - (float)uStack_1c0) + local_1b8 * 0.0 + fVar40;
          fVar41 = fVar40 + local_1b8 * 0.0 + (float)uStack_1c0 * 0.0 + uStack_1c0._4_4_;
          fVar40 = fVar40 + local_1b8 * -1.0 + fStack_54;
          fVar37 = local_1b4._4_4_ * 0.0 + (float)uStack_1ac * 0.0;
          fVar43 = fVar37 + uStack_1ac._4_4_ * 0.0 + local_1a4;
          fVar33 = local_1a4 * 0.0;
          fVar42 = ((float)uStack_1ac * 0.0 - local_1b4._4_4_) + uStack_1ac._4_4_ * 0.0 + fVar33;
          fVar34 = fVar33 + uStack_1ac._4_4_ * 0.0 + local_1b4._4_4_ * 0.0 + (float)uStack_1ac;
          fVar33 = fVar33 + uStack_1ac._4_4_ * -1.0 + fVar37;
          fStack_244 = fVar29 * local_298._4_4_;
          local_248 = fVar29 * local_288._4_4_;
          fStack_240 = fVar29 * local_2a8._4_4_;
          fStack_23c = fVar29 * local_2b8._4_4_;
          fVar36 = fVar35 * local_288._4_4_;
          fVar38 = fVar35 * local_298._4_4_;
          fVar39 = fVar35 * local_2a8._4_4_;
          fVar35 = fVar35 * local_2b8._4_4_;
          local_238 = fVar25 * (float)local_288 + fVar30 * local_288._4_4_;
          fStack_234 = fVar25 * (float)local_298 + fVar30 * local_298._4_4_;
          fStack_230 = fVar25 * (float)local_2a8 + fVar30 * local_2a8._4_4_;
          fStack_22c = fVar25 * (float)local_2b8 + fVar30 * local_2b8._4_4_;
          fVar25 = fVar28 * (float)local_288;
          fVar30 = fVar28 * (float)local_298;
          fVar37 = fVar28 * (float)local_2a8;
          fVar28 = fVar28 * (float)local_2b8;
          local_2b8 = CONCAT44(uStack_2b0._4_4_ * fVar34 +
                               fVar41 * (float)uStack_2b0 +
                               (float)local_2b8 * fVar26 + fVar31 * local_2b8._4_4_,
                               fVar42 * uStack_2b0._4_4_ +
                               fVar32 * (float)uStack_2b0 +
                               fVar27 * (float)local_2b8 + fVar29 * local_2b8._4_4_);
          uStack_2b0 = CONCAT44(fVar43 * uStack_2b0._4_4_ +
                                local_58 * (float)uStack_2b0 + fVar28 + fVar35,
                                fVar33 * uStack_2b0._4_4_ + (float)uStack_2b0 * fVar40 + fStack_22c)
          ;
          local_2a8 = CONCAT44(uStack_2a0._4_4_ * fVar34 +
                               fVar41 * (float)uStack_2a0 +
                               (float)local_2a8 * fVar26 + fVar31 * local_2a8._4_4_,
                               fVar42 * uStack_2a0._4_4_ +
                               fVar32 * (float)uStack_2a0 +
                               fVar27 * (float)local_2a8 + fVar29 * local_2a8._4_4_);
          uStack_2a0 = CONCAT44(fVar43 * uStack_2a0._4_4_ +
                                local_58 * (float)uStack_2a0 + fVar37 + fVar39,
                                fVar33 * uStack_2a0._4_4_ + (float)uStack_2a0 * fVar40 + fStack_230)
          ;
          local_288 = CONCAT44(uStack_280._4_4_ * fVar34 +
                               fVar41 * (float)uStack_280 +
                               (float)local_288 * fVar26 + fVar31 * local_288._4_4_,
                               fVar42 * uStack_280._4_4_ +
                               fVar32 * (float)uStack_280 +
                               fVar27 * (float)local_288 + fVar29 * local_288._4_4_);
          uStack_280 = CONCAT44(fVar43 * uStack_280._4_4_ +
                                local_58 * (float)uStack_280 + fVar25 + fVar36,
                                fVar33 * uStack_280._4_4_ + (float)uStack_280 * fVar40 + local_238);
          local_298 = CONCAT44(uStack_290._4_4_ * fVar34 +
                               fVar41 * (float)uStack_290 +
                               (float)local_298 * fVar26 + fVar31 * local_298._4_4_,
                               fVar42 * uStack_290._4_4_ +
                               fVar32 * (float)uStack_290 +
                               fVar27 * (float)local_298 + fVar29 * local_298._4_4_);
          uStack_290 = CONCAT44(fVar43 * uStack_290._4_4_ +
                                local_58 * (float)uStack_290 + fVar30 + fVar38,
                                fVar33 * uStack_290._4_4_ + (float)uStack_290 * fVar40 + fStack_234)
          ;
          fStack_50 = fStack_54;
          fStack_4c = fStack_54;
          break;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar23 != uVar22);
  }
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<matrix sid=\"matrix\">",0x15);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_288);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_288._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_280);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_280._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_298._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_290);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_290._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_2a8._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)uStack_2a0._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)local_2b8._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  poVar16 = std::ostream::_M_insert<double>((double)(float)uStack_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
  std::ostream::_M_insert<double>((double)uStack_2b0._4_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</matrix>",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  uVar12 = local_2e8->mNumMeshes;
  if (uVar12 == 0) {
    paVar19 = this->mScene;
    uVar23 = (ulong)(((_Rb_tree_header *)&paVar19->mNumCameras)->_M_header)._M_color;
    if (uVar23 != 0) {
      p_Var6 = (_Base_ptr)paVar19->mCameras;
      uVar12 = (local_2e8->mName).length;
      uVar22 = 0;
      local_2f0 = paVar19;
      do {
        puVar7 = *(uint **)(&p_Var6->_M_color + uVar22 * 2);
        if (*puVar7 == uVar12) {
          iVar11 = bcmp(puVar7 + 1,local_2f8,(ulong)uVar12);
          if (iVar11 == 0) {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"<instance_camera url=\"#",0x17);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-camera\"/>",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            paVar19 = this->mScene;
            break;
          }
        }
        uVar22 = uVar22 + 1;
        paVar19 = local_2f0;
      } while (uVar23 != uVar22);
    }
    uVar12 = paVar19->mNumLights;
    if ((ulong)uVar12 != 0) {
      lVar21 = *(long *)&(((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&paVar19->mLights)->_M_t)._M_impl;
      uVar2 = (local_2e8->mName).length;
      uVar23 = 0;
      do {
        puVar7 = *(uint **)(lVar21 + uVar23 * 8);
        if (*puVar7 == uVar2) {
          iVar11 = bcmp(puVar7 + 1,local_2f8,(ulong)uVar2);
          if (iVar11 == 0) {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"<instance_light url=\"#",0x16);
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar16,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-light\"/>",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
            break;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar12 != uVar23);
    }
  }
  else {
    local_2f8 = (string *)&this->mFoundSkeletonRootNodeID;
    uVar23 = 0;
    do {
      mesh = this->mScene->mMeshes[local_2e8->mMeshes[uVar23]];
      if ((mesh->mNumFaces != 0) && (mesh->mNumVertices != 0)) {
        if ((mesh->mName).length == 0) {
          GetMeshId_abi_cxx11_((string *)local_1e0,this,(ulong)local_2e8->mMeshes[uVar23]);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e0,(mesh->mName).data,(allocator<char> *)&local_318);
        }
        pcVar24 = (this->startstr)._M_dataplus._M_p;
        sVar5 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar24,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"<instance_geometry url=\"#",0x19);
          XMLIDEncode(&local_318,(string *)local_1e0);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,local_318._M_dataplus._M_p,local_318._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_2f0);
        }
        else {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar24,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"<instance_controller url=\"#",0x1b);
          XMLIDEncode(&local_318,(string *)local_1e0);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,local_318._M_dataplus._M_p,local_318._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-skin\">",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_2f0);
          paVar18 = findSkeletonRootNode(local_270,mesh);
          if (paVar18 != (aiNode *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_220,(paVar18->mName).data,&local_2d9);
            XMLIDEncode(&local_318,&local_220);
            std::__cxx11::string::_M_assign(local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
          }
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                               (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<skeleton>#",0xb);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar16,(this->mFoundSkeletonRootNodeID)._M_dataplus._M_p,
                               (this->mFoundSkeletonRootNodeID)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</skeleton>",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<bind_material>",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_2f0);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"<technique_common>",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)local_2f0);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,"<instance_material symbol=\"defaultMaterial\" target=\"#",0x35);
        XMLIDEncode(&local_318,
                    &(this->materials).
                     super__Vector_base<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                     ._M_impl.super__Vector_impl_data._M_start[mesh->mMaterialIndex].name);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,local_318._M_dataplus._M_p,local_318._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\">",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)local_2f0);
        lVar21 = 0;
        do {
          if ((mesh->mTextureCoords[lVar21] != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) {
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                 (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"<bind_vertex_input semantic=\"CHANNEL",0x24);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"\" input_semantic=\"TEXCOORD\" input_set=\"",0x27);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\"/>",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 8);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</instance_material>",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</technique_common>",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                             (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</bind_material>",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        PopTag(this);
        pcVar24 = (this->startstr)._M_dataplus._M_p;
        sVar5 = (this->startstr)._M_string_length;
        if (mesh->mNumBones == 0) {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar24,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</instance_geometry>",0x14);
        }
        else {
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)puVar1,pcVar24,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</instance_controller>",0x16);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
          operator_delete((void *)local_1e0._0_8_,
                          CONCAT44(aStack_1d0._M_allocated_capacity._4_4_,
                                   aStack_1d0._M_allocated_capacity._0_4_) + 1);
        }
        uVar12 = local_2e8->mNumMeshes;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar12);
  }
  paVar19 = local_270;
  paVar18 = local_2e8;
  if (local_2e8->mNumChildren != 0) {
    uVar23 = 0;
    do {
      WriteNode(this,paVar19,paVar18->mChildren[uVar23]);
      uVar23 = uVar23 + 1;
    } while (uVar23 < paVar18->mNumChildren);
  }
  PopTag(this);
  poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                       (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"</node>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteNode( const aiScene* pScene, aiNode* pNode)
{
    // the node must have a name
    if (pNode->mName.length == 0)
    {
        std::stringstream ss;
        ss << "Node_" << pNode;
        pNode->mName.Set(ss.str());
    }

    // If the node is associated with a bone, it is a joint node (JOINT)
    // otherwise it is a normal node (NODE)
    const char * node_type;
    bool is_joint, is_skeleton_root = false;
    if (nullptr == findBone(pScene, pNode->mName.C_Str())) {
        node_type = "NODE";
        is_joint = false;
    } else {
        node_type = "JOINT";
        is_joint = true;
        if (!pNode->mParent || nullptr == findBone(pScene, pNode->mParent->mName.C_Str())) {
            is_skeleton_root = true;
        }
    }

    const std::string node_id = XMLIDEncode(pNode->mName.data);
    const std::string node_name = XMLEscape(pNode->mName.data);
	mOutput << startstr << "<node ";
	if(is_skeleton_root) {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"" : "") ; // For now, only support one skeleton in a scene.
		mFoundSkeletonRootNodeID = node_id;
	} else {
		mOutput << "id=\"" << node_id << "\" " << (is_joint ? "sid=\"" + node_id +"\"": "") ;
	}
	
    mOutput << " name=\"" << node_name
            << "\" type=\"" << node_type
            << "\">" << endstr;
    PushTag();

    // write transformation - we can directly put the matrix there
    // TODO: (thom) decompose into scale - rot - quad to allow addressing it by animations afterwards
    aiMatrix4x4 mat = pNode->mTransformation;

    // If this node is a Camera node, the camera coordinate system needs to be multiplied in.
    // When importing from Collada, the mLookAt is set to 0, 0, -1, and the node transform is unchanged.
    // When importing from a different format, mLookAt is set to 0, 0, 1. Therefore, the local camera
    // coordinate system must be changed to matche the Collada specification.
    for (size_t i = 0; i<mScene->mNumCameras; i++){
        if (mScene->mCameras[i]->mName == pNode->mName){
            aiMatrix4x4 sourceView;
            mScene->mCameras[i]->GetCameraMatrix(sourceView);

            aiMatrix4x4 colladaView;
            colladaView.a1 = colladaView.c3 = -1; // move into -z space.
            mat *= (sourceView * colladaView);
            break;
        }
    }
	
	// customized, sid should be 'matrix' to match with loader code.
    //mOutput << startstr << "<matrix sid=\"transform\">";
	mOutput << startstr << "<matrix sid=\"matrix\">";
	
    mOutput << mat.a1 << " " << mat.a2 << " " << mat.a3 << " " << mat.a4 << " ";
    mOutput << mat.b1 << " " << mat.b2 << " " << mat.b3 << " " << mat.b4 << " ";
    mOutput << mat.c1 << " " << mat.c2 << " " << mat.c3 << " " << mat.c4 << " ";
    mOutput << mat.d1 << " " << mat.d2 << " " << mat.d3 << " " << mat.d4;
    mOutput << "</matrix>" << endstr;

    if(pNode->mNumMeshes==0){
        //check if it is a camera node
        for(size_t i=0; i<mScene->mNumCameras; i++){
            if(mScene->mCameras[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_camera url=\"#" << node_id << "-camera\"/>" << endstr;
                break;
            }
        }
        //check if it is a light node
        for(size_t i=0; i<mScene->mNumLights; i++){
            if(mScene->mLights[i]->mName == pNode->mName){
                mOutput << startstr <<"<instance_light url=\"#" << node_id << "-light\"/>" << endstr;
                break;
            }
        }

    }else
    // instance every geometry
    for( size_t a = 0; a < pNode->mNumMeshes; ++a )
    {
        const aiMesh* mesh = mScene->mMeshes[pNode->mMeshes[a]];
        // do not instantiate mesh if empty. I wonder how this could happen
        if( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
            continue;

        const std::string meshName = mesh->mName.length == 0 ? GetMeshId(pNode->mMeshes[a]) : mesh->mName.C_Str();

        if( mesh->mNumBones == 0 )
        {
            mOutput << startstr << "<instance_geometry url=\"#" << XMLIDEncode(meshName) << "\">" << endstr;
            PushTag();
        }
        else
        {
            mOutput << startstr
                    << "<instance_controller url=\"#" << XMLIDEncode(meshName) << "-skin\">"
                    << endstr;
            PushTag();

			// note! this mFoundSkeletonRootNodeID some how affects animation, it makes the mesh attaches to armature skeleton root node.
			// use the first bone to find skeleton root
			const aiNode * skeletonRootBoneNode = findSkeletonRootNode( pScene, mesh );
			if ( skeletonRootBoneNode ) {
				mFoundSkeletonRootNodeID = XMLIDEncode( skeletonRootBoneNode->mName.C_Str() );
			}
            mOutput << startstr << "<skeleton>#" << mFoundSkeletonRootNodeID << "</skeleton>" << endstr;
        }
        mOutput << startstr << "<bind_material>" << endstr;
        PushTag();
        mOutput << startstr << "<technique_common>" << endstr;
        PushTag();
        mOutput << startstr << "<instance_material symbol=\"defaultMaterial\" target=\"#" << XMLIDEncode(materials[mesh->mMaterialIndex].name) << "\">" << endstr;
        PushTag();
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords( static_cast<unsigned int>(a) ) )
                // semantic       as in <texture texcoord=...>
                // input_semantic as in <input semantic=...>
                // input_set      as in <input set=...>
                mOutput << startstr << "<bind_vertex_input semantic=\"CHANNEL" << a << "\" input_semantic=\"TEXCOORD\" input_set=\"" << a << "\"/>" << endstr;
        }
        PopTag();
        mOutput << startstr << "</instance_material>" << endstr;
        PopTag();
        mOutput << startstr << "</technique_common>" << endstr;
        PopTag();
        mOutput << startstr << "</bind_material>" << endstr;
        
        PopTag();
        if( mesh->mNumBones == 0)
            mOutput << startstr << "</instance_geometry>" << endstr;
        else
            mOutput << startstr << "</instance_controller>" << endstr;
    }

    // recurse into subnodes
    for( size_t a = 0; a < pNode->mNumChildren; ++a )
        WriteNode( pScene, pNode->mChildren[a]);

    PopTag();
    mOutput << startstr << "</node>" << endstr;
}